

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

void envy_bios_print_mem_train(envy_bios *bios,FILE *out,uint mask)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  char *__format;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar3 = strap;
  uVar1 = (bios->mem).train.offset;
  if ((mask >> 0xc & 1) == 0 || uVar1 == 0) {
    return;
  }
  fprintf((FILE *)out,"MEM TRAIN table at 0x%x, version %x\n",(ulong)uVar1,
          (ulong)(bios->mem).train.version);
  fprintf((FILE *)out,"Training clock: %huMHz\n\n",(ulong)(bios->mem).train.mclk);
  envy_bios_dump_hex(bios,out,(uint)(bios->mem).train.offset,(uint)(bios->mem).train.hlen,mask);
  if ((int)mask < 0) {
    fputc(10,(FILE *)out);
  }
  fwrite("Type | ",7,1,(FILE *)out);
  if ((bios->mem).train.subentries != '\0') {
    uVar4 = 0xff;
    if (uVar3 != 0) {
      uVar4 = uVar3 >> 2 & 7;
    }
    uVar6 = 0;
    do {
      if (uVar4 == uVar6) {
        __format = "%2u* ";
        uVar2 = uVar4;
      }
      else {
        __format = "%2u  ";
        uVar2 = uVar6;
      }
      fprintf((FILE *)out,__format,(ulong)uVar2);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (bios->mem).train.subentries);
  }
  fputc(10,(FILE *)out);
  uVar4 = 0;
  do {
    fputc(0x2d,(FILE *)out);
    uVar4 = uVar4 + 1;
  } while (uVar4 < (uint)(bios->mem).train.subentries * 4 + 6);
  fputc(10,(FILE *)out);
  if ((bios->mem).train.entriesnum != '\0') {
    lVar7 = 3;
    uVar8 = 0;
    do {
      fprintf((FILE *)out,"  %02hhx |",(ulong)(bios->mem).train.entries[uVar8].u00);
      if ((bios->mem).train.subentries != '\0') {
        uVar5 = 0;
        do {
          fprintf((FILE *)out," %02hhx ",
                  (ulong)((bios->mem).train.entries)->subentry[uVar5 + lVar7 + -3]);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (bios->mem).train.subentries);
      }
      fputc(10,(FILE *)out);
      envy_bios_dump_hex(bios,out,(uint)(bios->mem).train.entries[uVar8].offset,
                         (uint)(bios->mem).train.rlen,mask);
      envy_bios_dump_hex(bios,out,(uint)(bios->mem).train.rlen +
                                  (uint)(bios->mem).train.entries[uVar8].offset,
                         (uint)(bios->mem).train.subentries * (uint)(bios->mem).train.subentrylen,
                         mask);
      if ((int)mask < 0) {
        fputc(10,(FILE *)out);
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0xc;
    } while (uVar8 < (bios->mem).train.entriesnum);
  }
  fputc(10,(FILE *)out);
  return;
}

Assistant:

void
envy_bios_print_mem_train(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem_train *mt = &bios->mem.train;
	uint8_t ram_cfg = strap?(strap & 0x1c) >> 2:0xff;
	int i, j;

	if (!mt->offset || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "MEM TRAIN table at 0x%x, version %x\n", mt->offset, mt->version);
	fprintf(out, "Training clock: %huMHz\n\n", mt->mclk);
	envy_bios_dump_hex(bios, out, mt->offset, mt->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	fprintf(out, "Type | ");
	for (i = 0; i < mt->subentries; i++)
		if (i == ram_cfg)
			fprintf(out, "%2u* ", i);
		else
			fprintf(out, "%2u  ", i);
	fprintf(out, "\n");
	for (i = 0; i < mt->subentries * 4 + 6; i++)
		fprintf(out,"-");
	fprintf(out, "\n");

	for (i = 0; i < mt->entriesnum; i++) {
		fprintf(out, "  %02hhx |",
			mt->entries[i].u00);

		for (j = 0; j < mt->subentries; j++) {
			fprintf(out, " %02hhx ",
				mt->entries[i].subentry[j]);
		}
		fprintf(out, "\n");

		envy_bios_dump_hex(bios, out, mt->entries[i].offset, mt->rlen, mask);
		envy_bios_dump_hex(bios, out, mt->entries[i].offset+mt->rlen, mt->subentrylen * mt->subentries, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	}

	fprintf(out, "\n");
}